

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O1

int read_single_rle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              uint address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  Dwarf_Small *leb128;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  Dwarf_Small *leb128_00;
  char *pcVar5;
  char *pcVar6;
  char *local_80;
  char *local_78;
  dwarfstring_s local_70;
  int local_4c;
  Dwarf_Small *local_48;
  uint *local_40;
  char *local_38;
  
  if (enddata <= data) {
    pcVar4 = 
    "DW_DLE_RNGLISTS_ERROR: An rle entry begins past the end of its allowed space. Corrupt DWARF.";
    goto LAB_00185545;
  }
  pcVar4 = (char *)(ulong)*data;
  if (7 < *data) {
    dwarfstring_constructor(&local_70);
    dwarfstring_append_printf_u
              (&local_70,
               "DW_DLE_RNGLISTS_ERROR: The rangelists entry at .debug_rnglists offset 0x%x",
               dataoffset);
    dwarfstring_append_printf_u(&local_70," has code 0x%x which is unknown",(dwarfstring_u)pcVar4);
    pcVar4 = dwarfstring_string(&local_70);
    _dwarf_error_string(dbg,error,0x1d4,pcVar4);
    dwarfstring_destructor(&local_70);
    return 1;
  }
  leb128 = data + 1;
  local_40 = bytes_count_out;
  local_38 = pcVar4;
  switch(pcVar4) {
  case (char *)0x0:
    pcVar5 = (char *)0x1;
    leb128_00 = leb128;
    pcVar6 = pcVar4;
    break;
  case (char *)0x1:
    local_70.s_data = (char *)0x0;
    local_80 = (char *)0x0;
    iVar3 = dwarf_decode_leb128((char *)leb128,(Dwarf_Unsigned *)&local_70,
                                (Dwarf_Unsigned *)&local_80,(char *)enddata);
    if (iVar3 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
      return 1;
    }
    leb128_00 = leb128 + (long)local_70.s_data;
    pcVar5 = local_70.s_data + 1;
    pcVar6 = (char *)0x0;
    pcVar4 = local_80;
    break;
  default:
    local_70.s_data = (char *)0x0;
    local_80 = (char *)0x0;
    iVar3 = dwarf_decode_leb128((char *)leb128,(Dwarf_Unsigned *)&local_70,
                                (Dwarf_Unsigned *)&local_80,(char *)enddata);
    pcVar4 = local_70.s_data;
    local_78 = local_80;
    if (iVar3 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
      return 1;
    }
    leb128_00 = leb128 + (long)local_70.s_data;
    local_70.s_data = (char *)0x0;
    local_80 = (char *)0x0;
    iVar3 = dwarf_decode_leb128((char *)leb128_00,(Dwarf_Unsigned *)&local_70,
                                (Dwarf_Unsigned *)&local_80,(char *)enddata);
    if (iVar3 == 1) {
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
      pcVar5 = pcVar4;
      pcVar6 = (char *)0x0;
    }
    else {
      leb128_00 = leb128_00 + (long)local_70.s_data;
      pcVar5 = local_70.s_data;
      pcVar6 = local_80;
    }
    goto LAB_001858cd;
  case (char *)0x5:
    local_70.s_data = (char *)0x0;
    uVar2 = (ulong)address_size;
    leb128_00 = leb128 + uVar2;
    if (enddata < leb128_00) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      return 1;
    }
    (*dbg->de_copy_word)(&local_70,leb128,uVar2);
    pcVar5 = (char *)(uVar2 + 1);
    pcVar6 = (char *)0x0;
    pcVar4 = local_70.s_data;
    break;
  case (char *)0x6:
    local_70.s_data = (char *)0x0;
    uVar2 = (ulong)address_size;
    pDVar1 = leb128 + uVar2;
    if (enddata < pDVar1) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      return 1;
    }
    (*dbg->de_copy_word)(&local_70,leb128,uVar2);
    local_78 = local_70.s_data;
    local_70.s_data = (char *)0x0;
    leb128_00 = pDVar1 + uVar2;
    if (enddata < leb128_00) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      return 1;
    }
    (*dbg->de_copy_word)(&local_70,pDVar1,uVar2);
    pcVar5 = (char *)(uVar2 * 2 + 1);
    pcVar4 = local_78;
    pcVar6 = local_70.s_data;
    break;
  case (char *)0x7:
    local_70.s_data = (char *)0x0;
    pcVar4 = (char *)(ulong)address_size;
    local_48 = leb128 + (long)pcVar4;
    if (enddata < local_48) {
      _dwarf_error_string(dbg,error,0x14b,
                          "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
      local_78 = (char *)0x0;
    }
    else {
      (*dbg->de_copy_word)(&local_70,leb128,(unsigned_long)pcVar4);
      local_78 = local_70.s_data;
    }
    leb128_00 = local_48;
    if (enddata < local_48) {
      return 1;
    }
    local_70.s_data = (char *)0x0;
    local_80 = (char *)0x0;
    iVar3 = dwarf_decode_leb128((char *)local_48,(Dwarf_Unsigned *)&local_70,
                                (Dwarf_Unsigned *)&local_80,(char *)enddata);
    if (iVar3 == 1) {
      local_4c = iVar3;
      _dwarf_error_string(dbg,error,0x149,
                          "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d");
      pcVar5 = (char *)0x0;
      pcVar6 = (char *)0x0;
      iVar3 = local_4c;
    }
    else {
      leb128_00 = leb128_00 + (long)local_70.s_data;
      pcVar5 = local_70.s_data;
      pcVar6 = local_80;
    }
LAB_001858cd:
    if (iVar3 == 1) {
      return 1;
    }
    pcVar5 = pcVar4 + 1 + (long)pcVar5;
    pcVar4 = local_78;
  }
  if (enddata < leb128_00 || leb128_00 < data) {
    pcVar4 = "DW_DLE_RNGLISTS_ERROR: The end of an rle entry is past the end of its allowed space";
  }
  else {
    if (pcVar5 <= (char *)(dbg->de_debug_rnglists).dss_size) {
      *local_40 = (uint)pcVar5;
      *entry_kind = (uint)local_38;
      *entry_operand1 = (Dwarf_Unsigned)pcVar4;
      *entry_operand2 = (Dwarf_Unsigned)pcVar6;
      return 0;
    }
    pcVar4 = 
    "DW_DLE_RNGLISTS_ERROR: The number of bytes in a single rnglist entry is too large to be reasonable"
    ;
  }
LAB_00185545:
  _dwarf_error_string(dbg,error,0x1d4,pcVar4);
  return 1;
}

Assistant:

static int
read_single_rle_entry(Dwarf_Debug dbg,
    Dwarf_Small   *data,
    Dwarf_Unsigned dataoffset,
    Dwarf_Small   *enddata,
    unsigned       address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Small *  startdata = 0;

    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            "DW_DLE_RNGLISTS_ERROR: "
            "An rle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_RLE_end_of_list: break;
    case DW_RLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_startx_endx:
    case DW_RLE_startx_length:
    case DW_RLE_offset_pair: {
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_RLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_end: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_RLE_start_length: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    default: {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_RNGLISTS_ERROR: "
            "The rangelists entry at .debug_rnglists"
            " offset 0x%x" ,dataoffset);
        dwarfstring_append_printf_u(&m,
            " has code 0x%x which is unknown",code);
        _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/

        Dwarf_Unsigned sectionsize = dbg->de_debug_rnglists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The end of an rle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_RNGLISTS_ERROR,
                "DW_DLE_RNGLISTS_ERROR: "
                "The number of bytes in a single "
                "rnglist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }

    *bytes_count_out = (unsigned int)count;
    *entry_kind = code;
    *entry_operand1 = val1;
    *entry_operand2 = val2;
    return DW_DLV_OK;
}